

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O1

void __thiscall
ExprWriterTest_CallExprPrecedence_Test::~ExprWriterTest_CallExprPrecedence_Test
          (ExprWriterTest_CallExprPrecedence_Test *this)

{
  mp::BasicExprFactory<std::allocator<char>_>::~BasicExprFactory
            (&(this->super_ExprWriterTest).super_ExprFactory);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(ExprWriterTest, CallExprPrecedence) {
  auto x1 = MakeVariable(0), x2 = MakeVariable(1);
  auto f = AddFunction("foo", -1);
  mp::Expr args[] = {
      MakeCall(f, mp::MakeArrayRef<mp::Expr>(0, 0)),
      MakeBinary(ex::ADD, x1, MakeConst(5)),
      MakeConst(7),
      MakeUnary(ex::FLOOR, x2)
  };
  CHECK_WRITE("foo(foo(), x1 + 5, 7, floor(x2))", MakeCall(f, args));
}